

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.h
# Opt level: O0

vec2 CalcPos(vec2 Pos,vec2 Velocity,float Curvature,float Speed,float Time)

{
  vec2 vVar1;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  vec2 n;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_10;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  vector2_base<float>::vector2_base((vector2_base<float> *)&local_10);
  fVar2 = in_XMM4_Da * in_XMM3_Da;
  local_10.x = in_XMM1_Da * fVar2 + in_XMM0_Da;
  aStack_c.y = (in_XMM2_Da / 10000.0) * fVar2 * fVar2 + in_XMM1_Db * fVar2 + in_XMM0_Db;
  vVar1.field_1.y = aStack_c.y;
  vVar1.field_0.x = local_10.x;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return vVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline vec2 CalcPos(vec2 Pos, vec2 Velocity, float Curvature, float Speed, float Time)
{
	vec2 n;
	Time *= Speed;
	n.x = Pos.x + Velocity.x*Time;
	n.y = Pos.y + Velocity.y*Time + Curvature/10000*(Time*Time);
	return n;
}